

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccelf.c
# Opt level: O0

int tcc_object_type(int fd,Elf64_Ehdr *h)

{
  int iVar1;
  ssize_t sVar2;
  int size;
  Elf64_Ehdr *h_local;
  int fd_local;
  
  sVar2 = read(fd,h,0x40);
  if (((int)sVar2 == 0x40) && (iVar1 = memcmp(h,"\x7fELF",4), iVar1 == 0)) {
    if (h->e_type == 1) {
      return 1;
    }
    if (h->e_type == 3) {
      return 2;
    }
  }
  else if ((7 < (int)sVar2) && (iVar1 = memcmp(h,"!<arch>\n",8), iVar1 == 0)) {
    return 3;
  }
  return 0;
}

Assistant:

ST_FUNC int tcc_object_type(int fd, ElfW(Ehdr) * h) {
  int size = read(fd, h, sizeof *h);
  if (size == sizeof *h && 0 == memcmp(h, ELFMAG, 4)) {
    if (h->e_type == ET_REL)
      return AFF_BINTYPE_REL;
    if (h->e_type == ET_DYN)
      return AFF_BINTYPE_DYN;
  } else if (size >= 8) {
    if (0 == memcmp(h, ARMAG, 8))
      return AFF_BINTYPE_AR;
#ifdef TCC_TARGET_COFF
    if (((struct filehdr*)h)->f_magic == COFF_C67_MAGIC)
      return AFF_BINTYPE_C67;
#endif
  }
  return 0;
}